

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseConnection.cpp
# Opt level: O2

void __thiscall tonk::Connection::~Connection(Connection *this)

{
  (this->super_IConnection)._vptr_IConnection = (_func_int **)&PTR__Connection_0019bf08;
  (this->super_IIncomingHandler)._vptr_IIncomingHandler = (_func_int **)&PTR__Connection_0019bf48;
  LOCK();
  ActiveConnectionCount = ActiveConnectionCount + -1;
  UNLOCK();
  std::unique_ptr<asio::io_context::strand,_std::default_delete<asio::io_context::strand>_>::
  ~unique_ptr(&this->AsioEventStrand);
  std::
  unique_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_std::default_delete<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>_>_>
  ::~unique_ptr(&this->Ticker);
  std::unique_ptr<tonk::NATHolePuncher,_std::default_delete<tonk::NATHolePuncher>_>::~unique_ptr
            (&this->HolePuncher);
  std::unique_ptr<tonk::HostnameResolverState,_std::default_delete<tonk::HostnameResolverState>_>::
  ~unique_ptr(&this->ResolverState);
  MessageDecompressor::~MessageDecompressor(&(this->Incoming).Decompressor);
  SessionOutgoing::~SessionOutgoing(&this->Outgoing);
  std::__cxx11::string::~string((string *)&(this->Logger).Prefix);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->Deps).Context.super___shared_ptr<asio::io_context,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  IConnection::~IConnection(&this->super_IConnection);
  return;
}

Assistant:

Connection::~Connection()
{
    ActiveConnectionCount--;
}